

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O0

void __thiscall Saturation::ConsequenceFinder::onAllProcessed(ConsequenceFinder *this)

{
  bool bVar1;
  Store SVar2;
  SkipList<Kernel::Clause_*,_Lib::Int> **ppSVar3;
  Clause *in_RDI;
  Clause *rcl;
  ClauseSL *rlist;
  uint red;
  size_t in_stack_ffffffffffffffc8;
  Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *in_stack_ffffffffffffffd0;
  Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *this_00;
  SaturationAlgorithm *in_stack_ffffffffffffffe0;
  
  while (bVar1 = Lib::Stack<unsigned_int>::isNonEmpty
                           ((Stack<unsigned_int> *)&(in_RDI->super_Unit)._inference), bVar1) {
    Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)&(in_RDI->super_Unit)._inference);
    ppSVar3 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = (Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *)*ppSVar3;
    if (this_00 != (Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *)0x0) {
      ppSVar3 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      *ppSVar3 = (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0;
      while (bVar1 = Lib::SkipList<Kernel::Clause_*,_Lib::Int>::isNonEmpty
                               ((SkipList<Kernel::Clause_*,_Lib::Int> *)this_00), bVar1) {
        in_stack_ffffffffffffffe0 =
             (SaturationAlgorithm *)
             Lib::SkipList<Kernel::Clause_*,_Lib::Int>::pop
                       ((SkipList<Kernel::Clause_*,_Lib::Int> *)in_stack_ffffffffffffffe0);
        SVar2 = Kernel::Clause::store((Clause *)in_stack_ffffffffffffffe0);
        if (SVar2 != UNPROCESSED) {
          Kernel::Clause::store((Clause *)in_stack_ffffffffffffffe0);
        }
        SVar2 = Kernel::Clause::store((Clause *)in_stack_ffffffffffffffe0);
        if (SVar2 == PASSIVE) {
          SaturationAlgorithm::removeActiveOrPassiveClause(in_stack_ffffffffffffffe0,in_RDI);
        }
      }
      in_stack_ffffffffffffffd0 = this_00;
      if (this_00 != (Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*> *)0x0) {
        Lib::SkipList<Kernel::Clause_*,_Lib::Int>::~SkipList
                  ((SkipList<Kernel::Clause_*,_Lib::Int> *)this_00);
        Lib::SkipList<Kernel::Clause*,Lib::Int>::operator_delete(this_00,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd0 = this_00;
      }
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onAllProcessed()
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  while(_redundantsToHandle.isNonEmpty()) {
    unsigned red=_redundantsToHandle.pop();

    ClauseSL* rlist=_index[red];
    if(rlist) {
      _index[red]=0;
      while(rlist->isNonEmpty()) {
        Clause* rcl=rlist->pop();
        // Martin: there was comma in an if-statement -- Highly suspicious!
        // This has the same effect and doesn't trigger a warning, but should be revised when this code is understood.
        (void)(rcl->store()!=Clause::UNPROCESSED && rcl->store()!=Clause::NONE);
        if(rcl->store()) {
          //this case is not very likely to happen, but possible -- one clause is redundant
          //both due to the consequence-finding mode and to some backward simplification
          continue;
        }
        _sa->removeActiveOrPassiveClause(rcl);
      }
      delete rlist;
    }
  }
}